

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsvchdir.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int ino;
  int dev;
  stat s;
  char **argv_local;
  int argc_local;
  
  s.__glibc_reserved[2] = (__syscall_slong_t)(argv + 1);
  progname = *argv;
  if (((char **)s.__glibc_reserved[2] == (char **)0x0) ||
     (*(char **)s.__glibc_reserved[2] == (char *)0x0)) {
    usage();
  }
  new = *(char **)s.__glibc_reserved[2];
  if (*new == '.') {
    fatalx(new,": must not start with a dot.");
  }
  iVar1 = chdir("/etc/runit/runsvdir");
  if (iVar1 == -1) {
    fatal("unable to chdir: ","/etc/runit/runsvdir");
  }
  iVar1 = stat(new,(stat *)&ino);
  if (iVar1 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 == error_noent) {
      fatal(new,(char *)0x0);
    }
    fatal("unable to stat: ",new);
  }
  if (((uint)s.st_nlink & 0xf000) != 0x4000) {
    fatalx(new,"not a directory.");
  }
  iVar1 = (int)s.st_dev;
  iVar2 = (int)_ino;
  iVar3 = stat("current",(stat *)&ino);
  if (iVar3 == -1) {
    fatal("unable to stat: ","current");
  }
  if ((s.st_dev == (long)iVar1) && (_ino == (long)iVar2)) {
    buffer_puts(buffer_1,"runsvchdir: ");
    buffer_puts(buffer_1,new);
    buffer_puts(buffer_1,": current.\n");
    buffer_flush(buffer_1);
    _exit(0);
  }
  iVar1 = unlink("current.new");
  if ((iVar1 == -1) && (piVar4 = __errno_location(), *piVar4 != error_noent)) {
    fatal("unable to unlink: ","current.new");
  }
  iVar1 = symlink(new,"current.new");
  if (iVar1 == -1) {
    fatal("unable to create: current.new -> ",new);
  }
  iVar1 = unlink("previous");
  if ((iVar1 == -1) && (piVar4 = __errno_location(), *piVar4 != error_noent)) {
    fatal("unable to unlink: ","previous");
  }
  iVar1 = rename("current","previous");
  if (iVar1 == -1) {
    fatal("unable to copy: current to ","previous");
  }
  iVar1 = rename("current.new","current");
  if (iVar1 != -1) {
    buffer_puts(buffer_1,"runsvchdir: ");
    buffer_puts(buffer_1,new);
    buffer_puts(buffer_1,": now current.\n");
    buffer_flush(buffer_1);
    _exit(0);
  }
  warn("unable to move: current.new to ","current");
  iVar1 = rename("previous","current");
  if (iVar1 == -1) {
    fatal("unable to move previous back to ","current");
  }
  _exit(0x6f);
}

Assistant:

int main (int argc, char **argv) {
  struct stat s;
  int dev;
  int ino;

  progname =*argv++;
  if (! argv || ! *argv) usage();

  new =*argv;
  if (new[0] == '.') fatalx(new, ": must not start with a dot.");
  if (chdir(SVDIR) == -1) fatal("unable to chdir: ", SVDIR);

  if (stat(new, &s) == -1) {
    if (errno == error_noent) fatal(new, 0);
    fatal("unable to stat: ", new);
  }
  if (! S_ISDIR(s.st_mode)) fatalx(new, "not a directory.");
  ino =s.st_ino;
  dev =s.st_dev;
  if (stat("current", &s) == -1) fatal("unable to stat: ", "current");
  if ((s.st_ino == ino) && (s.st_dev == dev)) {
    buffer_puts(buffer_1, "runsvchdir: ");
    buffer_puts(buffer_1, new);
    buffer_puts(buffer_1, ": current.\n");
    buffer_flush(buffer_1);
    _exit(0);
  }

  if (unlink("current.new") == -1)
    if (errno != error_noent) fatal("unable to unlink: ", "current.new");
  if (symlink(new, "current.new") == -1)
    fatal("unable to create: current.new -> ", new);
  if (unlink("previous") == -1)
    if (errno != error_noent) fatal("unable to unlink: ", "previous");
  if (rename("current", "previous") == -1)
    fatal("unable to copy: current to ", "previous");
  if (rename("current.new", "current") == -1) {
    warn("unable to move: current.new to ", "current");
    if (rename("previous", "current") == -1)
      fatal("unable to move previous back to ", "current");
    _exit(111);
  }
  buffer_puts(buffer_1, "runsvchdir: ");
  buffer_puts(buffer_1, new);
  buffer_puts(buffer_1, ": now current.\n");
  buffer_flush(buffer_1);
  _exit(0);
}